

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

string * absl::Substitute_abi_cxx11_(string_view format,Arg *a0,Arg *a1,Arg *a2)

{
  string_view format_00;
  Arg *in_RCX;
  Nonnull<std::string_*> in_RDX;
  Arg *in_RSI;
  string *in_RDI;
  Arg *in_R8;
  char *unaff_retaddr;
  string *result;
  string *psVar1;
  
  psVar1 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  format_00._M_str = unaff_retaddr;
  format_00._M_len = (size_t)psVar1;
  SubstituteAndAppend(in_RDX,format_00,in_RSI,in_RCX,in_R8);
  return in_RDI;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string Substitute(
    absl::string_view format, const substitute_internal::Arg& a0,
    const substitute_internal::Arg& a1, const substitute_internal::Arg& a2) {
  std::string result;
  SubstituteAndAppend(&result, format, a0, a1, a2);
  return result;
}